

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcSop.c
# Opt level: O0

void Abc_SopComplement(char *pSop)

{
  char *local_18;
  char *pCur;
  char *pSop_local;
  
  local_18 = pSop;
  do {
    if (*local_18 == '\0') {
      return;
    }
    if (*local_18 == '\n') {
      if (local_18[-1] == '0') {
        local_18[-1] = '1';
      }
      else if (local_18[-1] == '1') {
        local_18[-1] = '0';
      }
      else if (local_18[-1] == 'x') {
        local_18[-1] = 'n';
      }
      else {
        if (local_18[-1] != 'n') {
          __assert_fail("0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abc/abcSop.c"
                        ,0x267,"void Abc_SopComplement(char *)");
        }
        local_18[-1] = 'x';
      }
    }
    local_18 = local_18 + 1;
  } while( true );
}

Assistant:

void Abc_SopComplement( char * pSop )
{
    char * pCur;
    for ( pCur = pSop; *pCur; pCur++ )
        if ( *pCur == '\n' )
        {
            if ( *(pCur - 1) == '0' )
                *(pCur - 1) = '1';
            else if ( *(pCur - 1) == '1' )
                *(pCur - 1) = '0';
            else if ( *(pCur - 1) == 'x' )
                *(pCur - 1) = 'n';
            else if ( *(pCur - 1) == 'n' )
                *(pCur - 1) = 'x';
            else
                assert( 0 );
        }
}